

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureFilteringExplicitLodTests.cpp
# Opt level: O1

bool __thiscall
vkt::texture::anon_unknown_3::Texture2DGradientTestCase::Generator::generate(Generator *this)

{
  MovePtr<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_> *this_00;
  Texture2DGradientTestCase *pTVar1;
  int i;
  Texture2D *this_01;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  Vec4 gMax;
  Vector<float,_4> res_3;
  Vec4 cScale;
  Vec4 gMin;
  Vec4 cBias;
  TextureFormatInfo fmtInfo;
  Vec4 local_d8;
  float local_c8 [8];
  Vec4 local_a8;
  Texture2D *local_98 [3];
  float local_80 [4];
  TextureFormatInfo local_70;
  
  this_01 = (Texture2D *)operator_new(0x50);
  pTVar1 = this->m_testCase;
  tcu::Texture2D::Texture2D
            (this_01,&pTVar1->m_format,(pTVar1->m_dimensions).m_data[0],
             (pTVar1->m_dimensions).m_data[1]);
  local_70.valueMin.m_data._0_8_ = (Texture2D *)0x0;
  this_00 = &this->m_tex;
  if ((this->m_tex).super_UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>.m_data.ptr
      != this_01) {
    de::details::UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>::reset
              (&this_00->super_UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>);
    (this_00->super_UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>).m_data.ptr =
         this_01;
  }
  de::details::UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>::reset
            ((UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_> *)&local_70);
  pTVar1 = this->m_testCase;
  uVar5 = (pTVar1->m_dimensions).m_data[0];
  uVar3 = (pTVar1->m_dimensions).m_data[1];
  if ((int)uVar3 < (int)uVar5) {
    uVar3 = uVar5;
  }
  if (uVar3 == 0) {
    uVar5 = 0x20;
  }
  else {
    uVar5 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> uVar5 == 0; uVar5 = uVar5 - 1) {
      }
    }
    uVar5 = uVar5 ^ 0x1f;
  }
  tcu::getTextureFormatInfo(&local_70,&pTVar1->m_format);
  local_98[0] = (Texture2D *)local_70.valueMin.m_data._0_8_;
  local_98[1] = (Texture2D *)local_70.valueMin.m_data._8_8_;
  local_c8[4] = 0.0;
  local_c8[5] = 0.0;
  local_c8[6] = 0.0;
  local_c8[7] = 0.0;
  lVar2 = 0;
  do {
    local_c8[lVar2 + 4] = local_70.valueMax.m_data[lVar2] - *(float *)((long)&local_70 + lVar2 * 4);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  if (uVar3 != 0) {
    uVar4 = 0;
    do {
      local_c8[0] = 0.0;
      local_c8[1] = 0.0;
      local_c8[2] = 0.0;
      local_c8[3] = 1.0;
      local_d8.m_data[0] = 0.0;
      local_d8.m_data[1] = 0.0;
      local_d8.m_data[2] = 0.0;
      local_d8.m_data[3] = 0.0;
      lVar2 = 0;
      do {
        local_d8.m_data[lVar2] = local_c8[lVar2] * local_c8[lVar2 + 4];
        lVar2 = lVar2 + 1;
      } while (lVar2 != 4);
      local_a8.m_data[0] = 0.0;
      local_a8.m_data[1] = 0.0;
      local_a8.m_data[2] = 0.0;
      local_a8.m_data[3] = 0.0;
      lVar2 = 0;
      do {
        local_a8.m_data[lVar2] = local_d8.m_data[lVar2] + *(float *)((long)local_98 + lVar2 * 4);
        lVar2 = lVar2 + 1;
      } while (lVar2 != 4);
      local_80[0] = 1.0;
      local_80[1] = 1.0;
      local_80[2] = 1.0;
      local_80[3] = 0.0;
      local_c8[0] = 0.0;
      local_c8[1] = 0.0;
      local_c8[2] = 0.0;
      local_c8[3] = 0.0;
      lVar2 = 0;
      do {
        local_c8[lVar2] = local_80[lVar2] * local_c8[lVar2 + 4];
        lVar2 = lVar2 + 1;
      } while (lVar2 != 4);
      local_d8.m_data[0] = 0.0;
      local_d8.m_data[1] = 0.0;
      local_d8.m_data[2] = 0.0;
      local_d8.m_data[3] = 0.0;
      lVar2 = 0;
      do {
        local_d8.m_data[lVar2] = local_c8[lVar2] + *(float *)((long)local_98 + lVar2 * 4);
        lVar2 = lVar2 + 1;
      } while (lVar2 != 4);
      tcu::Texture2D::allocLevel
                ((this_00->super_UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>).
                 m_data.ptr,(int)uVar4);
      tcu::fillWithComponentGradients
                ((PixelBufferAccess *)
                 (uVar4 * 0x28 +
                 (long)(((this_00->
                         super_UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>).
                         m_data.ptr)->super_TextureLevelPyramid).m_access.
                       super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                       ._M_impl.super__Vector_impl_data._M_start),&local_a8,&local_d8);
      uVar4 = uVar4 + 1;
    } while (uVar4 != (0x20 - uVar5) + (uint)(0x20 - uVar5 == 0));
  }
  return true;
}

Assistant:

virtual bool generate (void)
	{
		m_tex = de::MovePtr<Texture2D>(new Texture2D(m_testCase->m_format,
													 m_testCase->m_dimensions[0],
													 m_testCase->m_dimensions[1]));

		const deUint8 numLevels = (deUint8) (1 + deLog2Floor32(de::max(m_testCase->m_dimensions[0],
																	   m_testCase->m_dimensions[1])));

		const TextureFormatInfo fmtInfo = getTextureFormatInfo(m_testCase->m_format);

		const Vec4 cBias  = fmtInfo.valueMin;
		const Vec4 cScale = fmtInfo.valueMax - fmtInfo.valueMin;

		for (deUint8 levelNdx = 0; levelNdx < numLevels; ++levelNdx)
		{
			const Vec4 gMin = Vec4(0.0f, 0.0f, 0.0f, 1.0f) * cScale + cBias;
			const Vec4 gMax = Vec4(1.0f, 1.0f, 1.0f, 0.0f) * cScale + cBias;

			m_tex->allocLevel(levelNdx);
			fillWithComponentGradients(m_tex->getLevel(levelNdx), gMin, gMax);
		}

		return true;
	}